

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_zip.c
# Opt level: O0

int ZIPPreDecode(TIFF *tif,uint16_t s)

{
  uint8_t *puVar1;
  int iVar2;
  undefined4 local_24;
  ZIPState *sp;
  uint16_t s_local;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  if (puVar1 != (uint8_t *)0x0) {
    if ((*(uint *)(puVar1 + 0xf4) & 1) == 0) {
      (*tif->tif_setupdecode)(tif);
    }
    *(uint8_t **)(puVar1 + 0x80) = tif->tif_rawdata;
    if ((ulong)tif->tif_rawcc < 0xffffffff) {
      local_24 = (undefined4)tif->tif_rawcc;
    }
    else {
      local_24 = 0xffffffff;
    }
    *(undefined4 *)(puVar1 + 0x88) = local_24;
    iVar2 = inflateReset((z_streamp)(puVar1 + 0x80));
    return (int)(iVar2 == 0);
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_zip.c"
                ,0x89,"int ZIPPreDecode(TIFF *, uint16_t)");
}

Assistant:

static int ZIPPreDecode(TIFF *tif, uint16_t s)
{
    ZIPState *sp = DecoderState(tif);

    (void)s;
    assert(sp != NULL);

    if ((sp->state & ZSTATE_INIT_DECODE) == 0)
        tif->tif_setupdecode(tif);

#if LIBDEFLATE_SUPPORT
    sp->libdeflate_state = -1;
#endif
    sp->stream.next_in = tif->tif_rawdata;
    assert(sizeof(sp->stream.avail_in) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_in = (uint64_t)tif->tif_rawcc < 0xFFFFFFFFU
                              ? (uInt)tif->tif_rawcc
                              : 0xFFFFFFFFU;
    return (inflateReset(&sp->stream) == Z_OK);
}